

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

void __thiscall
soul::StructuralParser::parseTopLevelDecl(StructuralParser *this,Namespace *parentNamespace)

{
  SourceCodeText *o;
  _func_int **pp_Var1;
  char *__s1;
  bool bVar2;
  int iVar3;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  CompileMessage local_70;
  undefined1 local_38 [16];
  
  parseImports(this,parentNamespace);
  o = (this->super_SOULTokeniser).location.sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  pp_Var1 = (_func_int **)(this->super_SOULTokeniser).location.location.data;
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27bb0c);
  if (bVar2) {
    if (o != (SourceCodeText *)0x0) {
      (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
    }
    local_80._0_8_ = o;
    local_80._8_8_ = pp_Var1;
    parseProcessorDecl((StructuralParser *)&stack0xffffffffffffffd8,(CodeLocation *)this,
                       (Namespace *)local_80);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_80._0_8_);
    goto LAB_001d1863;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27d6a8);
  if (bVar2) {
    if (o != (SourceCodeText *)0x0) {
      (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
    }
    local_90._0_8_ = o;
    local_90._8_8_ = pp_Var1;
    parseGraphDecl((StructuralParser *)(local_38 + 8),(CodeLocation *)this,(Namespace *)local_90);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_90._0_8_);
    goto LAB_001d1863;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27b500);
  if (bVar2) {
    if (o != (SourceCodeText *)0x0) {
      (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
    }
    local_a0._0_8_ = o;
    local_a0._8_8_ = pp_Var1;
    parseNamespaceDecl((StructuralParser *)local_38,(CodeLocation *)this,(ModuleBase *)local_a0);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_a0._0_8_);
    goto LAB_001d1863;
  }
  __s1 = (this->super_SOULTokeniser).currentType.text;
  if (__s1 == "import") {
LAB_001d17cd:
    CompileMessageHelpers::createMessage<>
              (&local_70,syntax,error,
               "Import statements can only be declared at the start of a namespace");
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_70);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_70.location.sourceCode.object);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.description._M_dataplus._M_p != &local_70.description.field_2) {
      operator_delete(local_70.description._M_dataplus._M_p,
                      (ulong)(local_70.description.field_2._M_allocated_capacity + 1));
    }
  }
  else if (__s1 != (char *)0x0) {
    iVar3 = strcmp(__s1,"import");
    if (iVar3 == 0) goto LAB_001d17cd;
  }
  CompileMessageHelpers::createMessage<>
            (&local_70,syntax,error,"Expected a graph, processor or namespace declaration");
  (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_70);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_70.location.sourceCode.object);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.description._M_dataplus._M_p != &local_70.description.field_2) {
    operator_delete(local_70.description._M_dataplus._M_p,
                    (ulong)(local_70.description.field_2._M_allocated_capacity + 1));
  }
LAB_001d1863:
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  return;
}

Assistant:

void parseTopLevelDecl (AST::Namespace& parentNamespace)
    {
        parseImports (parentNamespace);
        auto keywordLocation = location;

        if (matchIf (Keyword::processor))      { parseProcessorDecl (keywordLocation, parentNamespace); return; }
        if (matchIf (Keyword::graph))          { parseGraphDecl     (keywordLocation, parentNamespace); return; }
        if (matchIf (Keyword::namespace_))     { parseNamespaceDecl (keywordLocation, parentNamespace); return; }
        if (matches (Keyword::import))         throwError (Errors::importsMustBeAtStart());

        throwError (Errors::expectedTopLevelDecl());
    }